

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImSpan<ImGuiTableColumn> *this;
  float fVar1;
  char cVar2;
  ImDrawList *pIVar3;
  ImDrawListSplitter *this_00;
  float fVar4;
  ImGuiContext *pIVar5;
  ImRect IVar6;
  ImRect IVar7;
  ImGuiTableInstanceData *pIVar8;
  ImGuiTableCellData *pIVar9;
  ImGuiTableColumn *pIVar10;
  int column_n;
  int iVar11;
  int iVar12;
  ImU32 col;
  ImGuiWindow *window;
  int iVar13;
  ImU32 col_00;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImRect row_rect;
  ImRect local_68;
  int local_58;
  int local_54;
  ImGuiWindow *local_50;
  ImU32 local_48;
  int local_44;
  ImGuiTableCellData *local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  window = GImGui->CurrentWindow;
  if (window != table->InnerWindow) {
    __assert_fail("window == table->InnerWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x6d0,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->IsInsideRow == false) {
    __assert_fail("table->IsInsideRow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x6d1,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar5->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  fVar1 = table->RowPosY2;
  (window->DC).CursorPos.y = fVar1;
  fVar17 = table->RowPosY1;
  iVar13 = table->CurrentRow;
  iVar12 = (int)table->FreezeRowsCount;
  iVar11 = (int)table->FreezeRowsRequest;
  if (iVar13 == 0) {
    local_50 = (ImGuiWindow *)CONCAT44(local_50._4_4_,fVar1 - fVar17);
    pIVar8 = TableGetInstanceData(table,(int)table->InstanceCurrent);
    pIVar8->LastFirstRowHeight = local_50._0_4_;
  }
  iVar13 = iVar13 + 1;
  if (((table->InnerClipRect).Min.y <= fVar1) && (fVar17 <= (table->InnerClipRect).Max.y)) {
    col = table->RowBgColor[0];
    local_58 = iVar12;
    local_54 = iVar13;
    if ((col == 0x1000000) && (col = 0, (table->Flags & 0x40) != 0)) {
      col = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
    }
    col_00 = table->RowBgColor[1];
    local_48 = 0;
    if (col_00 == 0x1000000) {
      col_00 = 0;
    }
    if (((0 < table->CurrentRow) || (table->InnerWindow == table->OuterWindow)) &&
       (local_48 = 0, (table->Flags & 0x80) != 0)) {
      local_48 = table->RowBgColor[(ulong)((table->field_0x9a & 1) == 0) + 2];
    }
    cVar2 = table->RowCellDataCurrent;
    local_44 = iVar11;
    if ((-1 < cVar2 || local_54 == local_58) || (local_48 != 0 || (col_00 != 0 || col != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar15 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar16 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar4 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar3 = window->DrawList;
        (pIVar3->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar3->_CmdHeader).ClipRect.y = fVar15;
        (pIVar3->_CmdHeader).ClipRect.z = fVar16;
        (pIVar3->_CmdHeader).ClipRect.w = fVar4;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,window->DrawList,0);
    }
    if (col_00 != 0 || col != 0) {
      local_68.Min.y = fVar17;
      local_68.Min.x = (table->WorkRect).Min.x;
      local_68.Max.x = (table->WorkRect).Max.x;
      local_68.Max.y = fVar1;
      ImRect::ClipWith(&local_68,&table->BgClipRect);
      if ((col != 0) && (local_68.Min.y < local_68.Max.y)) {
        ImDrawList::AddRectFilled(window->DrawList,&local_68.Min,&local_68.Max,col,0.0,0);
      }
      if ((col_00 != 0) && (local_68.Min.y < local_68.Max.y)) {
        ImDrawList::AddRectFilled(window->DrawList,&local_68.Min,&local_68.Max,col_00,0.0,0);
      }
    }
    local_50 = window;
    if (-1 < cVar2) {
      local_40 = ImSpan<ImGuiTableCellData>::operator[]
                           (&table->RowCellData,(int)table->RowCellDataCurrent);
      pIVar9 = ImSpan<ImGuiTableCellData>::operator[](&table->RowCellData,0);
      for (; pIVar9 <= local_40; pIVar9 = pIVar9 + 1) {
        pIVar10 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)pIVar9->Column);
        local_68 = TableGetCellBgRect(table,(int)pIVar9->Column);
        ImRect::ClipWith(&local_68,&table->BgClipRect);
        IVar6 = local_68;
        fVar15 = (pIVar10->ClipRect).Min.x;
        fVar16 = local_68.Max.x;
        uVar14 = -(uint)(fVar15 <= local_68.Min.x);
        local_68.Min.x = (float)(uVar14 & (uint)local_68.Min.x | ~uVar14 & (uint)fVar15);
        IVar7 = local_68;
        if (pIVar10->MaxX <= fVar16) {
          fVar16 = pIVar10->MaxX;
        }
        local_68.Max.y = IVar6.Max.y;
        local_68.Min = IVar7.Min;
        local_68.Max.x = fVar16;
        ImDrawList::AddRectFilled
                  (local_50->DrawList,&local_68.Min,&local_68.Max,pIVar9->BgColor,0.0,0);
      }
    }
    window = local_50;
    if (((local_48 != 0) && ((table->BgClipRect).Min.y <= fVar17)) &&
       (fVar17 < (table->BgClipRect).Max.y)) {
      local_68.Min.y = fVar17;
      local_68.Min.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = fVar17;
      ImDrawList::AddLine(local_50->DrawList,&local_68.Min,&local_38,local_48,1.0);
    }
    iVar11 = local_44;
    iVar13 = local_54;
    iVar12 = local_58;
    if (((local_54 == local_58) && ((table->BgClipRect).Min.y <= fVar1)) &&
       (fVar1 < (table->BgClipRect).Max.y)) {
      local_68.Min.y = fVar1;
      local_68.Min.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = fVar1;
      ImDrawList::AddLine(window->DrawList,&local_68.Min,&local_38,table->BorderColorStrong,1.0);
    }
  }
  if (iVar13 == iVar11) {
    for (iVar11 = 0; iVar11 < table->ColumnsCount; iVar11 = iVar11 + 1) {
      pIVar10 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar11);
      pIVar10->NavLayerCurrent = iVar11 < table->FreezeColumnsCount;
    }
  }
  if (iVar13 == iVar12) {
    if (table->IsUnfrozenRows != false) {
      __assert_fail("table->IsUnfrozenRows == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                    ,0x736,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    table->IsUnfrozenRows = true;
    fVar1 = table->RowPosY2;
    fVar17 = (window->InnerClipRect).Min.y;
    fVar15 = (window->InnerClipRect).Max.y;
    uVar14 = -(uint)(fVar17 <= fVar1 + 1.0);
    fVar17 = (float)(~uVar14 & (uint)fVar17 | (uint)(fVar1 + 1.0) & uVar14);
    if (fVar15 <= fVar17) {
      fVar17 = fVar15;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar17;
    (table->BgClipRect).Min.y = fVar17;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar15;
    (table->BgClipRect).Max.y = fVar15;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    if (fVar15 < fVar17) {
      __assert_fail("table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                    ,0x73e,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    fVar17 = table->RowPosY1;
    fVar15 = (fVar1 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (window->DC).CursorPos.y = fVar15;
    table->RowPosY2 = fVar15;
    table->RowPosY1 = fVar15 - (fVar1 - fVar17);
    this = &table->Columns;
    for (iVar13 = 0; iVar13 < table->ColumnsCount; iVar13 = iVar13 + 1) {
      pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,iVar13);
      pIVar10->DrawChannelCurrent = pIVar10->DrawChannelUnfrozen;
      (pIVar10->ClipRect).Min.y = (table->Bg2ClipRectForDrawCmd).Min.y;
    }
    pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,0);
    SetWindowClipRectBeforeSetChannel(window,&pIVar10->ClipRect);
    this_00 = table->DrawSplitter;
    pIVar3 = window->DrawList;
    pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,0);
    ImDrawListSplitter::SetCurrentChannel(this_00,pIVar3,(uint)pIVar10->DrawChannelCurrent);
  }
  if ((table->field_0x98 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        TableGetInstanceData(table, table->InstanceCurrent)->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                // As we render the BG here we need to clip things (for layout we would not)
                // FIXME: This cancels the OuterPadding addition done by TableGetCellBgRect(), need to keep it while rendering correctly while scrolling.
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped when scrolling
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}